

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void __thiscall BaseIndex::Sync(BaseIndex *this)

{
  long lVar1;
  uint256 *puVar2;
  bool bVar3;
  int iVar4;
  CBlockIndex *index;
  int *piVar5;
  CBlockIndex *block_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  Level level;
  char *in_stack_fffffffffffffeb0;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  int *local_138;
  BlockInfo block_info;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  block_00 = (this->m_best_block_index)._M_b._M_p;
  if (((this->m_synced)._M_base._M_i & 1U) == 0) {
    in_stack_fffffffffffffeb8 = &this->m_name;
    in_stack_fffffffffffffec0 = (int *)0x0;
    local_138 = (int *)0x0;
    do {
      fmt = (char *)0x48caa2;
      bVar3 = CThreadInterrupt::operator_cast_to_bool(&this->m_interrupt);
      if (bVar3) {
        logging_function_00._M_str = "Sync";
        logging_function_00._M_len = 4;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
        ;
        source_file_00._M_len = 0x57;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_00,source_file_00,0x97,
                   IPC|COINDB|MEMPOOLREJ|PRUNE|CMPCTBLOCK|REINDEX|SELECTCOINS|WALLETDB|ZMQ|HTTP|
                   MEMPOOL|NET,(Level)in_stack_fffffffffffffeb8,fmt,in_stack_fffffffffffffeb8);
        SetBestBlockIndex(this,block_00);
        in_stack_fffffffffffffeb0 = (char *)0x48ce35;
        Commit(this);
        bVar3 = false;
        goto LAB_0048ce3e;
      }
      block.super_CBlockHeader._0_8_ = &cs_main;
      block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
           block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ &
           0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&block);
      index = NextSyncBlock(block_00,&this->m_chainstate->m_chain);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&block);
      if (index == (CBlockIndex *)0x0) {
        SetBestBlockIndex(this,block_00);
        Commit(this);
        block.super_CBlockHeader._0_8_ = &cs_main;
        block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
             block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ &
             0xffffffffffffff00;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&block);
        index = NextSyncBlock(block_00,&this->m_chainstate->m_chain);
        iVar4 = 0;
        if (index == (CBlockIndex *)0x0) {
          LOCK();
          (this->m_synced)._M_base._M_i = true;
          UNLOCK();
          iVar4 = 3;
        }
        in_stack_fffffffffffffeb0 = (char *)0x48cb41;
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&block);
        if (index != (CBlockIndex *)0x0) goto LAB_0048cb4a;
      }
      else {
LAB_0048cb4a:
        if ((index->pprev == block_00) || (bVar3 = Rewind(this,block_00,index->pprev), bVar3)) {
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          block.super_CBlockHeader.nBits = 0;
          block.super_CBlockHeader.nNonce = 0;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0'
          ;
          block.super_CBlockHeader.nTime = 0;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.nVersion = 0;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          block.fChecked = false;
          block.m_checked_witness_commitment = false;
          block.m_checked_merkle_root = false;
          kernel::MakeBlockInfo(&block_info,index,(CBlock *)0x0);
          bVar3 = ::node::BlockManager::ReadBlockFromDisk
                            (this->m_chainstate->m_blockman,&block,index);
          if (bVar3) {
            block_info.data = &block;
            iVar4 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xc])
                              (this,&block_info);
            if ((char)iVar4 == '\0') {
              puVar2 = index->phashBlock;
              if (puVar2 == (uint256 *)0x0) goto LAB_0048cedf;
              local_e8 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
              uStack_e0 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
              local_d8 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
              uStack_d0 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_(&local_c8,&local_e8);
              FatalErrorf<char[5],std::__cxx11::string>
                        (this,"%s: Failed to write block %s to index database",
                         (char (*) [5])0x80db86,&local_c8);
              goto LAB_0048cda1;
            }
            piVar5 = (int *)std::chrono::_V2::steady_clock::now();
            if ((long)(local_138 + 7500000000) < (long)piVar5) {
              logging_function._M_str = "Sync";
              logging_function._M_len = 4;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
              ;
              source_file._M_len = 0x57;
              LogPrintf_<std::__cxx11::string,int>
                        (logging_function,source_file,0xce,
                         IPC|COINDB|MEMPOOLREJ|PRUNE|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|ZMQ|
                         NET,(Level)in_stack_fffffffffffffeb8,(char *)&index->nHeight,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
              local_138 = piVar5;
            }
            iVar4 = 0;
            if ((long)(in_stack_fffffffffffffec0 + 7500000000) < (long)piVar5) {
              SetBestBlockIndex(this,index);
              Commit(this);
              in_stack_fffffffffffffec0 = piVar5;
            }
          }
          else {
            puVar2 = index->phashBlock;
            if (puVar2 == (uint256 *)0x0) {
LAB_0048cedf:
              __assert_fail("phashBlock != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                            ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
            }
            local_e8 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
            uStack_e0 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
            local_d8 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
            uStack_d0 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
            base_blob<256u>::ToString_abi_cxx11_(&local_c8,&local_e8);
            FatalErrorf<char[5],std::__cxx11::string>
                      (this,"%s: Failed to read block %s from disk",(char (*) [5])0x80db86,&local_c8
                      );
LAB_0048cda1:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            iVar4 = 1;
          }
          in_stack_fffffffffffffeb0 = (char *)0x48cdd9;
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&block.vtx);
          block_00 = index;
        }
        else {
          in_stack_fffffffffffffeb0 = (char *)0x48cd52;
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,"%s: Failed to rewind index %s to a previous chain tip",
                     (char (*) [5])0x80db86,in_stack_fffffffffffffeb8);
          iVar4 = 1;
        }
      }
    } while (iVar4 == 0);
    bVar3 = iVar4 == 3;
LAB_0048ce3e:
    if (!bVar3) goto LAB_0048ceb4;
  }
  level = (int)this + 0x90;
  if (block_00 == (CBlockIndex *)0x0) {
    logging_function_02._M_str = "Sync";
    logging_function_02._M_len = 4;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp";
    source_file_02._M_len = 0x57;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_02,0xde,
               IPC|COINDB|MEMPOOLREJ|PRUNE|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|ZMQ|
               HTTP|NET,level,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  }
  else {
    logging_function_01._M_str = "Sync";
    logging_function_01._M_len = 4;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp";
    source_file_01._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,int>
              (logging_function_01,source_file_01,0xdc,
               IPC|COINDB|MEMPOOLREJ|PRUNE|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|HTTP|
               MEMPOOL|NET,level,(char *)&block_00->nHeight,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffec0);
  }
LAB_0048ceb4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::Sync()
{
    const CBlockIndex* pindex = m_best_block_index.load();
    if (!m_synced) {
        std::chrono::steady_clock::time_point last_log_time{0s};
        std::chrono::steady_clock::time_point last_locator_write_time{0s};
        while (true) {
            if (m_interrupt) {
                LogPrintf("%s: m_interrupt set; exiting ThreadSync\n", GetName());

                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. If it fails, the error will be already be
                // logged. The best way to recover is to continue, as index cannot be corrupted by
                // a missed commit to disk for an advanced index state.
                Commit();
                return;
            }

            const CBlockIndex* pindex_next = WITH_LOCK(cs_main, return NextSyncBlock(pindex, m_chainstate->m_chain));
            // If pindex_next is null, it means pindex is the chain tip, so
            // commit data indexed so far.
            if (!pindex_next) {
                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. See rationale above.
                Commit();

                // If pindex is still the chain tip after committing, exit the
                // sync loop. It is important for cs_main to be locked while
                // setting m_synced = true, otherwise a new block could be
                // attached while m_synced is still false, and it would not be
                // indexed.
                LOCK(::cs_main);
                pindex_next = NextSyncBlock(pindex, m_chainstate->m_chain);
                if (!pindex_next) {
                    m_synced = true;
                    break;
                }
            }
            if (pindex_next->pprev != pindex && !Rewind(pindex, pindex_next->pprev)) {
                FatalErrorf("%s: Failed to rewind index %s to a previous chain tip", __func__, GetName());
                return;
            }
            pindex = pindex_next;


            CBlock block;
            interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex);
            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *pindex)) {
                FatalErrorf("%s: Failed to read block %s from disk",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            } else {
                block_info.data = &block;
            }
            if (!CustomAppend(block_info)) {
                FatalErrorf("%s: Failed to write block %s to index database",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            }

            auto current_time{std::chrono::steady_clock::now()};
            if (last_log_time + SYNC_LOG_INTERVAL < current_time) {
                LogPrintf("Syncing %s with block chain from height %d\n",
                          GetName(), pindex->nHeight);
                last_log_time = current_time;
            }

            if (last_locator_write_time + SYNC_LOCATOR_WRITE_INTERVAL < current_time) {
                SetBestBlockIndex(pindex);
                last_locator_write_time = current_time;
                // No need to handle errors in Commit. See rationale above.
                Commit();
            }
        }
    }

    if (pindex) {
        LogPrintf("%s is enabled at height %d\n", GetName(), pindex->nHeight);
    } else {
        LogPrintf("%s is enabled\n", GetName());
    }
}